

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<QtGraphicsAnchorLayout::GraphPath>::end(QList<QtGraphicsAnchorLayout::GraphPath> *this)

{
  GraphPath *n;
  QArrayDataPointer<QtGraphicsAnchorLayout::GraphPath> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QtGraphicsAnchorLayout::GraphPath> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QtGraphicsAnchorLayout::GraphPath> *)0x9664e9);
  QArrayDataPointer<QtGraphicsAnchorLayout::GraphPath>::operator->(in_RDI);
  n = QArrayDataPointer<QtGraphicsAnchorLayout::GraphPath>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }